

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

int Cnf_GiaSolveOne(Gia_Man_t *p,Cnf_Dat_t *pCnf,int nTimeOut,int *pnVars,int *pnConfs)

{
  int iVar1;
  int iVar2;
  sat_solver *s;
  Abc_Cex_t *pAVar3;
  long lVar4;
  abctime aVar5;
  timespec ts;
  timespec local_40;
  
  s = sat_solver_new();
  sat_solver_setnvars(s,pCnf->nVars);
  lVar4 = 0;
  do {
    if (pCnf->nClauses <= lVar4) {
      if (nTimeOut == 0) {
        aVar5 = 0;
      }
      else {
        iVar1 = clock_gettime(3,&local_40);
        if (iVar1 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        aVar5 = lVar4 + (long)nTimeOut * 1000000;
      }
      s->nRuntimeLimit = aVar5;
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      iVar2 = sat_solver_nvars(s);
      *pnVars = iVar2;
      iVar2 = sat_solver_nconflicts(s);
      *pnConfs = iVar2;
      if (iVar1 == 1) {
        pAVar3 = Cec_SplitDeriveModel(p,pCnf,s);
        p->pCexComb = pAVar3;
      }
      sat_solver_delete(s);
      return -(uint)(iVar1 == 0) | (uint)(iVar1 == -1);
    }
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[lVar4],pCnf->pClauses[lVar4 + 1]);
    lVar4 = lVar4 + 1;
  } while (iVar1 != 0);
  sat_solver_delete(s);
  *pnVars = 0;
  *pnConfs = 0;
  return 1;
}

Assistant:

static inline int Cnf_GiaSolveOne( Gia_Man_t * p, Cnf_Dat_t * pCnf, int nTimeOut, int * pnVars, int * pnConfs )
{
    int status;
    sat_solver * pSat = Cec_GiaDeriveSolver( p, pCnf, nTimeOut );
    if ( pSat == NULL )
    {
        *pnVars = 0;
        *pnConfs = 0;
        return 1;
    }
    status   = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    *pnVars  = sat_solver_nvars( pSat );
    *pnConfs = sat_solver_nconflicts( pSat );
    if ( status == l_True )
        p->pCexComb = Cec_SplitDeriveModel( p, pCnf, pSat );
    sat_solver_delete( pSat );
    if ( status == l_Undef )
        return -1;
    if ( status == l_False )
        return 1;
    return 0;
}